

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O2

double __thiscall ConnectFourState::get_result(ConnectFourState *this,int current_player_to_move)

{
  char cVar1;
  double dVar2;
  
  check_invariant(this);
  cVar1 = get_winner(this);
  if (cVar1 == '.') {
    dVar2 = 0.5;
  }
  else {
    dVar2 = 0.0;
    if (cVar1 != ".XO"[current_player_to_move]) {
      dVar2 = 1.0;
    }
  }
  return dVar2;
}

Assistant:

double get_result(int current_player_to_move) const
	{
		dattest( ! has_moves());
		check_invariant();

		auto winner = get_winner();
		if (winner == player_markers[0]) {
			return 0.5;
		}

		if (winner == player_markers[current_player_to_move]) {
			return 0.0;
		}
		else {
			return 1.0;
		}
	}